

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Clara::CommandLine<Catch::ConfigData>::Arg::hasShortName(Arg *this,string *shortName)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  
  pbVar4 = (this->shortNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->shortNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pbVar4 != pbVar1;
  if (bVar5) {
    __s2 = (shortName->_M_dataplus)._M_p;
    sVar2 = shortName->_M_string_length;
    do {
      __n = pbVar4->_M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          return bVar5;
        }
        iVar3 = bcmp((pbVar4->_M_dataplus)._M_p,__s2,__n);
        if (iVar3 == 0) {
          return bVar5;
        }
      }
      pbVar4 = pbVar4 + 1;
      bVar5 = pbVar4 != pbVar1;
    } while (bVar5);
  }
  return bVar5;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }